

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLowerGraph.cpp
# Opt level: O0

void PrintConstant(OutputContext *ctx,VmConstant *constant)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  char *pcVar7;
  VmConstant *constant_local;
  OutputContext *ctx_local;
  
  bVar6 = VmType::operator==(&(constant->super_VmValue).type,&VmType::Void);
  if (bVar6) {
    Print(ctx,"{}");
  }
  else {
    bVar6 = VmType::operator==(&(constant->super_VmValue).type,&VmType::Int);
    if (bVar6) {
      Print(ctx,"%d",(ulong)(uint)constant->iValue);
    }
    else {
      bVar6 = VmType::operator==(&(constant->super_VmValue).type,&VmType::Double);
      if (bVar6) {
        Print(ctx,"%f",constant->dValue);
      }
      else {
        bVar6 = VmType::operator==(&(constant->super_VmValue).type,&VmType::Long);
        if (bVar6) {
          Print(ctx,"%lldl",constant->lValue);
        }
        else if ((((constant->super_VmValue).type.type == VM_TYPE_POINTER) &&
                 (constant->container != (VariableData *)0x0)) && (constant->iValue != 0)) {
          pcVar3 = (constant->container->name->name).end;
          pcVar4 = (constant->container->name->name).begin;
          pcVar5 = (constant->container->name->name).begin;
          uVar1 = constant->container->uniqueId;
          uVar2 = constant->iValue;
          bVar6 = HasAddressTaken(constant->container);
          pcVar7 = " (noalias)";
          if (bVar6) {
            pcVar7 = "";
          }
          Print(ctx,"%.*s.v%04x+0x%x%s",(ulong)(uint)((int)pcVar3 - (int)pcVar4),pcVar5,(ulong)uVar1
                ,(ulong)uVar2,pcVar7);
        }
        else if (((constant->super_VmValue).type.type == VM_TYPE_POINTER) &&
                (constant->container != (VariableData *)0x0)) {
          pcVar3 = (constant->container->name->name).end;
          pcVar4 = (constant->container->name->name).begin;
          pcVar5 = (constant->container->name->name).begin;
          uVar1 = constant->container->uniqueId;
          bVar6 = HasAddressTaken(constant->container);
          pcVar7 = " (noalias)";
          if (bVar6) {
            pcVar7 = "";
          }
          Print(ctx,"%.*s.v%04x%s",(ulong)(uint)((int)pcVar3 - (int)pcVar4),pcVar5,(ulong)uVar1,
                pcVar7);
        }
        else if ((constant->super_VmValue).type.type == VM_TYPE_POINTER) {
          Print(ctx,"0x%x",(ulong)(uint)constant->iValue);
        }
        else if ((constant->super_VmValue).type.type == VM_TYPE_STRUCT) {
          Print(ctx,"{ %.*s }",
                (ulong)(uint)((int)(((constant->super_VmValue).type.structType)->name).end -
                             (int)(((constant->super_VmValue).type.structType)->name).begin),
                (((constant->super_VmValue).type.structType)->name).begin);
        }
        else if ((constant->super_VmValue).type.type == VM_TYPE_BLOCK) {
          Print(ctx,"%.*s.b%d",
                (ulong)(uint)((int)(constant->bValue->name).end -
                             (int)(constant->bValue->name).begin),(constant->bValue->name).begin,
                (ulong)constant->bValue->uniqueId);
        }
        else if (((constant->super_VmValue).type.type == VM_TYPE_FUNCTION) &&
                (constant->fValue->function != (FunctionData *)0x0)) {
          Print(ctx,"%.*s.f%04x",
                (ulong)(uint)((int)(constant->fValue->function->name->name).end -
                             (int)(constant->fValue->function->name->name).begin),
                (constant->fValue->function->name->name).begin,
                (ulong)constant->fValue->function->uniqueId);
        }
        else {
          if ((constant->super_VmValue).type.type != VM_TYPE_FUNCTION) {
            __assert_fail("!\"unknown type\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLowerGraph.cpp"
                          ,0x54,"void PrintConstant(OutputContext &, VmConstant *)");
          }
          Print(ctx,"global.f0000");
        }
      }
    }
  }
  return;
}

Assistant:

void PrintConstant(OutputContext &ctx, VmConstant *constant)
{
	if(constant->type == VmType::Void)
		Print(ctx, "{}");
	else if(constant->type == VmType::Int)
		Print(ctx, "%d", constant->iValue);
	else if(constant->type == VmType::Double)
		Print(ctx, "%f", constant->dValue);
	else if(constant->type == VmType::Long)
		Print(ctx, "%lldl", constant->lValue);
	else if(constant->type.type == VM_TYPE_POINTER && constant->container && constant->iValue)
		Print(ctx, "%.*s.v%04x+0x%x%s", FMT_ISTR(constant->container->name->name), constant->container->uniqueId, constant->iValue, HasAddressTaken(constant->container) ? "" : " (noalias)");
	else if(constant->type.type == VM_TYPE_POINTER && constant->container)
		Print(ctx, "%.*s.v%04x%s", FMT_ISTR(constant->container->name->name), constant->container->uniqueId, HasAddressTaken(constant->container) ? "" : " (noalias)");
	else if(constant->type.type == VM_TYPE_POINTER)
		Print(ctx, "0x%x", constant->iValue);
	else if(constant->type.type == VM_TYPE_STRUCT)
		Print(ctx, "{ %.*s }", FMT_ISTR(constant->type.structType->name));
	else if(constant->type.type == VM_TYPE_BLOCK)
		Print(ctx, "%.*s.b%d", FMT_ISTR(constant->bValue->name), constant->bValue->uniqueId);
	else if(constant->type.type == VM_TYPE_FUNCTION && constant->fValue->function)
		Print(ctx, "%.*s.f%04x", FMT_ISTR(constant->fValue->function->name->name), constant->fValue->function->uniqueId);
	else if(constant->type.type == VM_TYPE_FUNCTION)
		Print(ctx, "global.f0000");
	else
		assert(!"unknown type");
}